

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Qualifier.cpp
# Opt level: O0

void __thiscall Refal2::CQualifier::printChars(CQualifier *this,ostream *outputStream)

{
  undefined *puVar1;
  bool bVar2;
  size_t sVar3;
  reference pcVar4;
  _Self local_178;
  _Self local_170;
  const_iterator i_1;
  set<char,_std::less<char>,_std::allocator<char>_> a;
  undefined1 auStack_130 [4];
  int i;
  byte local_119;
  undefined1 auStack_118 [7];
  bool superFlag;
  _Base_bitset<2UL> local_108;
  undefined1 local_f8 [8];
  CAnsiSet other;
  string local_e0 [39];
  allocator local_b9;
  string local_b8 [39];
  allocator local_91;
  string local_90 [55];
  allocator local_59;
  string local_58 [32];
  undefined1 local_38 [8];
  CAnsiSet D;
  CAnsiSet L;
  ostream *outputStream_local;
  CQualifier *this_local;
  
  join_0x00000010_0x00000000_ =
       (_WordT  [2])std::operator&(&this->ansichars,(bitset<128UL> *)CQualifierBuilder::AnsiL);
  _local_38 = (_WordT  [2])
              std::operator&(&this->ansichars,(bitset<128UL> *)CQualifierBuilder::AnsiD);
  puVar1 = CQualifierBuilder::Alphabet;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_58,puVar1,&local_59);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,"L",&local_91);
  printAnsiSet(outputStream,(CAnsiSet *)(D.super__Base_bitset<2UL>._M_w + 1),(string *)local_58,
               (string *)local_90);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  puVar1 = CQualifierBuilder::Numbers;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b8,puVar1,&local_b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_e0,"D",(allocator *)((long)other.super__Base_bitset<2UL>._M_w + 0xf));
  printAnsiSet(outputStream,(CAnsiSet *)local_38,(string *)local_b8,(string *)local_e0);
  std::__cxx11::string::~string(local_e0);
  std::allocator<char>::~allocator
            ((allocator<char> *)((long)other.super__Base_bitset<2UL>._M_w + 0xf));
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  _auStack_118 = (_WordT  [2])
                 std::operator|((bitset<128UL> *)(D.super__Base_bitset<2UL>._M_w + 1),
                                (bitset<128UL> *)local_38);
  local_108._M_w = (_WordT  [2])std::bitset<128UL>::operator~((bitset<128UL> *)auStack_118);
  _local_f8 = (_WordT  [2])std::operator&(&this->ansichars,(bitset<128UL> *)&local_108);
  sVar3 = std::bitset<128UL>::count((bitset<128UL> *)local_f8);
  local_119 = sVar3 < 0x1f;
  if (!(bool)local_119) {
    _auStack_130 = (_WordT  [2])
                   std::operator|((bitset<128UL> *)CQualifierBuilder::AnsiL,
                                  (bitset<128UL> *)CQualifierBuilder::AnsiD);
    std::bitset<128UL>::operator|=((bitset<128UL> *)local_f8,(bitset<128UL> *)auStack_130);
    std::operator<<(outputStream,"(");
  }
  std::operator<<(outputStream,"\'");
  for (a._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 1;
      a._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ < 0x80;
      a._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
           a._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ + 1) {
    bVar2 = std::bitset<128UL>::test
                      ((bitset<128UL> *)local_f8,
                       (long)(int)a._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_);
    if (bVar2 == (bool)(local_119 & 1)) {
      std::operator<<(outputStream,(char)a._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_);
    }
  }
  std::operator<<(outputStream,"\' ");
  if ((local_119 & 1) == 0) {
    std::operator<<(outputStream,")");
  }
  bVar2 = IsIncludeAllChars(this);
  if ((bVar2) && (bVar2 = CFastSet<char>::IsEmpty(&this->chars), !bVar2)) {
    std::operator<<(outputStream,"(");
  }
  bVar2 = CFastSet<char>::IsEmpty(&this->chars);
  if (!bVar2) {
    std::operator<<(outputStream,"\'");
  }
  std::set<char,_std::less<char>,_std::allocator<char>_>::set
            ((set<char,_std::less<char>,_std::allocator<char>_> *)&i_1);
  CFastSet<char>::GetSet(&this->chars,(set<char,_std::less<char>,_std::allocator<char>_> *)&i_1);
  local_170._M_node =
       (_Base_ptr)
       std::set<char,_std::less<char>,_std::allocator<char>_>::begin
                 ((set<char,_std::less<char>,_std::allocator<char>_> *)&i_1);
  while( true ) {
    local_178._M_node =
         (_Base_ptr)
         std::set<char,_std::less<char>,_std::allocator<char>_>::end
                   ((set<char,_std::less<char>,_std::allocator<char>_> *)&i_1);
    bVar2 = std::operator!=(&local_170,&local_178);
    if (!bVar2) break;
    pcVar4 = std::_Rb_tree_const_iterator<char>::operator*(&local_170);
    std::operator<<(outputStream,*pcVar4);
    std::_Rb_tree_const_iterator<char>::operator++(&local_170);
  }
  bVar2 = CFastSet<char>::IsEmpty(&this->chars);
  if (!bVar2) {
    std::operator<<(outputStream,"\'");
  }
  bVar2 = IsIncludeAllChars(this);
  if ((bVar2) && (bVar2 = CFastSet<char>::IsEmpty(&this->chars), !bVar2)) {
    std::operator<<(outputStream,") ");
  }
  bVar2 = IsIncludeAllChars(this);
  if (bVar2) {
    std::operator<<(outputStream,"O ");
  }
  else {
    std::operator<<(outputStream,"(O) ");
  }
  std::set<char,_std::less<char>,_std::allocator<char>_>::~set
            ((set<char,_std::less<char>,_std::allocator<char>_> *)&i_1);
  return;
}

Assistant:

void CQualifier::printChars( std::ostream& outputStream ) const
{
	CAnsiSet L = ansichars & CQualifierBuilder::AnsiL;
	CAnsiSet D = ansichars & CQualifierBuilder::AnsiD;

	printAnsiSet( outputStream, L, CQualifierBuilder::Alphabet, "L" );
	printAnsiSet( outputStream, D, CQualifierBuilder::Numbers, "D" );

	CAnsiSet other = ansichars & ~(L | D);
	bool superFlag = other.count() < 31;
	if( !superFlag ) {
		other |= CQualifierBuilder::AnsiL | CQualifierBuilder::AnsiD;
		outputStream << "(";
	}
	outputStream << "'";
	for( int i = 1; i < AnsiSetSize; i++ ) {
		if( other.test( i ) == superFlag ) {
			outputStream << static_cast<char>( i );
		}
	}
	outputStream << "' ";
	if( !superFlag ) {
		outputStream << ")";
	}

	if( IsIncludeAllChars() && !chars.IsEmpty() ) {
		outputStream << "(";
	}
	if( !chars.IsEmpty() ) {
		outputStream << "'";
	}
	std::set<TChar> a;
	chars.GetSet( &a );
	for( std::set<TChar>::const_iterator i = a.begin(); i != a.end(); ++i ) {
		outputStream << *i;
	}
	if( !chars.IsEmpty() ) {
		outputStream << "'";
	}
	if( IsIncludeAllChars() && !chars.IsEmpty() ) {
		outputStream << ") ";
	}

	if( IsIncludeAllChars() ) {
		outputStream << "O ";
	} else {
		outputStream << "(O) ";
	}
}